

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O2

bool ImGui::FilteredCfgNumber
               (char *label,char *filter,dataRefsLT idx,int v_min,int v_max,int v_step,char *format)

{
  bool bVar1;
  
  bVar1 = FilteredLabel(label,filter,true);
  if (bVar1) {
    PushID(label);
    bVar1 = SliderDr("",idx,v_min,v_max,v_step,format);
    PopID();
    TableNextCell();
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

IMGUI_API bool FilteredCfgNumber(const char* label, const char* filter, dataRefsLT idx,
                                 int v_min, int v_max, int v_step, const char* format)
{
    // Draw label first
    if (!FilteredLabel(label, filter))
        return false;

    // Next cell: Draw the checkbox with a value linked to the dataRef
    PushID(label);
    const bool bRet = SliderDr("", idx, v_min, v_max, v_step, format);
    PopID();
    TableNextCell();
    return bRet;
}